

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

void __thiscall
HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  *psVar1;
  FILE *__stream;
  size_type sVar2;
  int i;
  int index;
  char *pcVar3;
  char *in_R9;
  bool bVar4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__2;
  key_type local_210;
  AssertionResult gtest_ar_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  TypeParam ht_in;
  TypeParam ht_out;
  
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((ulong)gtest_ar_.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl & 0xffffffff00000000);
  gtest_ar__2.success_ = false;
  gtest_ar__2._1_7_ = 0;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((ulong)gtest_ar__2.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl & 0xffffffff00000000);
  ht_in.
  super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface._0_4_ = 0;
  ht_in.
  super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.settings.
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .super_Hasher.id_ = 0;
  ht_in.
  super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.settings.
  super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
  .super_Hasher.num_hashes_ = 0;
  google::
  HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (&ht_out,0,(hasher *)&gtest_ar_,(key_equal *)&gtest_ar__2,(allocator_type *)&ht_in);
  HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((key_type *)&ht_in,
              (HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)this,2000);
  psVar1 = &ht_out.
            super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  google::
  sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::set_deleted_key(&psVar1->rep,(key_type *)&ht_in);
  std::__cxx11::string::~string((string *)&ht_in);
  for (index = 1; index != 100; index = index + 1) {
    UniqueObjectHelper<std::__cxx11::string>((string *)&gtest_ar_,index);
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((pair<google::BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)&ht_in,
             &ht_out.
              super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
             ,(string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&gtest_ar_);
  }
  HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((key_type *)&ht_in,
              (HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)this,0x38);
  google::
  sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&psVar1->rep,(key_type *)&ht_in);
  std::__cxx11::string::~string((string *)&ht_in);
  HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((key_type *)&ht_in,
              (HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)this,0x16);
  google::
  sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&psVar1->rep,(key_type *)&ht_in);
  std::__cxx11::string::~string((string *)&ht_in);
  __stream = tmpfile();
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar4 = __stream != (FILE *)0x0;
  gtest_ar_.success_ = bVar4;
  if (!bVar4) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ht_in,(internal *)&gtest_ar_,(AssertionResult *)"fp != __null","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4b8,(char *)CONCAT44(ht_in.
                                       super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                       ._vptr_BaseHashtableInterface._4_4_,
                                       ht_in.
                                       super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                       ._vptr_BaseHashtableInterface._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_210,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_210);
    std::__cxx11::string::~string((string *)&ht_in);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       google::
       sparse_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
       ::serialize<ValueSerializer,_IO_FILE>
                 ((sparse_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
                   *)psVar1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ht_in,(internal *)&gtest_ar_,
               (AssertionResult *)"ht_out.serialize(ValueSerializer(), fp)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4b9,(char *)CONCAT44(ht_in.
                                       super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                       ._vptr_BaseHashtableInterface._4_4_,
                                       ht_in.
                                       super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                                       ._vptr_BaseHashtableInterface._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_210,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_210);
    std::__cxx11::string::~string((string *)&ht_in);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  rewind(__stream);
  gtest_ar__2.success_ = false;
  gtest_ar__2._1_7_ = 0;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((ulong)gtest_ar__2.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl & 0xffffffff00000000);
  local_210._M_dataplus._M_p = (pointer)0x0;
  local_210._M_string_length._0_4_ = 0;
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  google::
  HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (&ht_in,0,(hasher *)&gtest_ar__2,(key_equal *)&local_210,(allocator_type *)&gtest_ar_);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__2.success_ = bVar4;
  if (__stream == (FILE *)0x0) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,(AssertionResult *)"fp != __null",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4bd,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)local_210._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_210._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  psVar1 = &ht_in.
            super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  gtest_ar__2.success_ =
       google::
       sparse_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
       ::unserialize<ValueSerializer,_IO_FILE>
                 ((sparse_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
                   *)psVar1,__stream);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__2.success_) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
               (AssertionResult *)"ht_in.unserialize(ValueSerializer(), fp)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4be,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)local_210._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_210._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  fclose(__stream);
  UniqueObjectHelper<std::__cxx11::string>((string *)&gtest_ar__2,1);
  HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(&local_210,
              (HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)this,1);
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((iterator *)&gtest_ar_,
         &ht_in.
          super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
         ,&local_210);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"this->UniqueObject(1)","*ht_in.find(this->UniqueKey(1))",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar__2,
             local_1d0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  UniqueObjectHelper<std::__cxx11::string>((string *)&gtest_ar__2,99);
  HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(&local_210,
              (HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)this,99);
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((iterator *)&gtest_ar_,
         &ht_in.
          super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
         ,&local_210);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"this->UniqueObject(99)","*ht_in.find(this->UniqueKey(99))",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar__2,
             local_1d0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((key_type *)&gtest_ar_,
              (HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)this,100);
  sVar2 = google::
          sparse_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
          ::count<std::__cxx11::string>
                    ((sparse_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
                      *)psVar1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_
                    );
  gtest_ar__2.success_ = sVar2 == 0;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&gtest_ar_);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
               (AssertionResult *)"ht_in.count(this->UniqueKey(100))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c3,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)local_210._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_210._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  UniqueObjectHelper<std::__cxx11::string>((string *)&gtest_ar__2,0x15);
  HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(&local_210,
              (HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)this,0x15);
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::find((iterator *)&gtest_ar_,
         &ht_in.
          super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
         ,&local_210);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"this->UniqueObject(21)","*ht_in.find(this->UniqueKey(21))",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar__2,
             local_1d0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((key_type *)&gtest_ar_,
              (HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)this,0x16);
  sVar2 = google::
          sparse_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
          ::count<std::__cxx11::string>
                    ((sparse_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
                      *)psVar1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_
                    );
  gtest_ar__2.success_ = sVar2 == 0;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&gtest_ar_);
  if (gtest_ar__2.success_ == false) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
               (AssertionResult *)"ht_in.count(this->UniqueKey(22))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c6,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)local_210._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_210._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((key_type *)&gtest_ar_,
              (HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
               *)this,0x38);
  sVar2 = google::
          sparse_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
          ::count<std::__cxx11::string>
                    ((sparse_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
                      *)psVar1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_
                    );
  gtest_ar__2.success_ = sVar2 == 0;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&gtest_ar_);
  if (sVar2 != 0) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
               (AssertionResult *)"ht_in.count(this->UniqueKey(56))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c7,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)local_210._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_210._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::~BaseHashtableInterface
            (&ht_in.
              super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
            );
  google::
  BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::~BaseHashtableInterface
            (&ht_out.
              super_BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
            );
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Serialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(ValueSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(ValueSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}